

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mip_level::unpack_from_dxt(mip_level *this,bool uncook)

{
  image_u8 *p;
  bool bVar1;
  image_u8 *pNew_img;
  bool uncook_local;
  mip_level *this_local;
  
  bVar1 = this->m_pDXTImage != (dxt_image *)0x0;
  if (bVar1) {
    p = (image_u8 *)crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)this)
    ;
    assign(this,p,PIXEL_FMT_INVALID,this->m_orient_flags);
  }
  return bVar1;
}

Assistant:

bool mip_level::unpack_from_dxt(bool uncook) {
  if (!m_pDXTImage)
    return false;

  image_u8* pNew_img = crnlib_new<image_u8>();
  CRNLIB_ASSERT(get_unpacked_image(*pNew_img, uncook ? cUnpackFlagUncook : 0) == pNew_img);

  assign(pNew_img, PIXEL_FMT_INVALID, m_orient_flags);
  return true;
}